

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s.hpp
# Opt level: O3

iterator __thiscall
estl::
sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
::do_find_bisect(sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                 *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pvVar2;
  size_type sVar3;
  uint uVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  ulong uVar5;
  size_type __n;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar6;
  value_type elem;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  paVar1 = &local_a8.first.field_2;
  local_a8.first._M_string_length = 0;
  local_a8.first.field_2._M_local_buf[0] = '\0';
  local_a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_68,key,&local_a8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.first._M_dataplus._M_p,
                    CONCAT71(local_a8.first.field_2._M_allocated_capacity._1_7_,
                             local_a8.first.field_2._M_local_buf[0]) + 1);
  }
  pvVar2 = (this->data_vec_).data_ptr_;
  ppVar6 = pvVar2 + (this->data_vec_).size_;
  __p = std::
        __lower_bound<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::pair<std::__cxx11::string_const,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_val<estl::sort_map_s<std::__cxx11::string,std::__cxx11::string,30ul,std::less<std::__cxx11::string>,10ul>::comperator>>
                  (pvVar2,ppVar6,&local_68);
  if (__p == ppVar6) goto LAB_00102cee;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_a8,__p);
  sVar3 = local_a8.first._M_string_length;
  __n = local_68.first._M_string_length;
  if (local_a8.first._M_string_length < local_68.first._M_string_length) {
    __n = local_a8.first._M_string_length;
  }
  if (__n == 0) {
LAB_00102c91:
    uVar5 = 0xffffffff80000000;
    if (-0x80000000 < (long)(local_68.first._M_string_length - sVar3)) {
      uVar5 = local_68.first._M_string_length - sVar3;
    }
    if (0x7ffffffe < (long)uVar5) {
      uVar5 = 0x7fffffff;
    }
  }
  else {
    uVar4 = memcmp(local_68.first._M_dataplus._M_p,local_a8.first._M_dataplus._M_p,__n);
    uVar5 = (ulong)uVar4;
    if (uVar4 == 0) goto LAB_00102c91;
  }
  if ((int)uVar5 < 0) {
    __p = ppVar6;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.second._M_dataplus._M_p != &local_a8.second.field_2) {
    operator_delete(local_a8.second._M_dataplus._M_p,
                    local_a8.second.field_2._M_allocated_capacity + 1);
  }
  ppVar6 = __p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.first._M_dataplus._M_p,
                    CONCAT71(local_a8.first.field_2._M_allocated_capacity._1_7_,
                             local_a8.first.field_2._M_local_buf[0]) + 1);
  }
LAB_00102cee:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.second._M_dataplus._M_p != &local_68.second.field_2) {
    operator_delete(local_68.second._M_dataplus._M_p,
                    local_68.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != &local_68.first.field_2) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  return ppVar6;
}

Assistant:

iterator do_find_bisect (const Key& key)
    {
        //std::cerr << "do_find_bisect(" << key << ")\n";
        const value_type elem (key,T());

        const iterator it_end = end();
        const iterator it = std::lower_bound(data_vec_.begin(), it_end, elem, comperator_);
        return !(it == it_end) && !comperator_(elem, *it) ? it : it_end;
    }